

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

void __thiscall
CTcHostIfcDynComp::v_print_err(CTcHostIfcDynComp *this,char *msg,__va_list_tag *args)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  long in_RDI;
  char *newbuf;
  size_t need;
  size_t curlen;
  size_t len;
  char *f;
  __va_list_tag *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  __s = t3vsprintf_alloc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    lVar2 = *(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 8);
    lVar3 = lVar2 + sVar1;
    if (*(ulong *)(in_RDI + 0x10) < lVar3 + 1U) {
      *(long *)(in_RDI + 0x10) = lVar3 + 0x401;
      pvVar4 = realloc(*(void **)(in_RDI + 8),*(size_t *)(in_RDI + 0x10));
      if (pvVar4 == (void *)0x0) {
        return;
      }
      *(void **)(in_RDI + 8) = pvVar4;
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 8) + lVar2;
    }
    memcpy(*(void **)(in_RDI + 0x18),__s,sVar1 + 1);
    *(size_t *)(in_RDI + 0x18) = sVar1 + *(long *)(in_RDI + 0x18);
    free(__s);
  }
  return;
}

Assistant:

virtual void v_print_err(const char *msg, va_list args)
    {
        /* format the message */
        char *f = t3vsprintf_alloc(msg, args);
        if (f == 0)
            return;
        
        /* get the length */
        size_t len = strlen(f);
        
        /* expand our buffer if necessary */
        size_t curlen = p_ - errmsg_;
        size_t need = curlen + len + 1;
        if (need > erralo_)
        {
            erralo_ = need + 1024;
            char *newbuf = (char *)t3realloc(errmsg_, erralo_);
            if (newbuf == 0)
                return;
            
            /* switch to the new buffer */
            errmsg_ = newbuf;
            p_ = errmsg_ + curlen;
        }
        
        /* append the message */
        memcpy(p_, f, len + 1);
        
        /* bump the write pointer */
        p_ += len;

        /* done with the allocated message text */
        t3free(f);
    }